

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O2

void cleanup_dun_data(dun_data *dd)

{
  ulong uVar1;
  long lVar2;
  int **p;
  
  cave_connectors_free(dun->join);
  cave_connectors_free(dun->one_off_above);
  cave_connectors_free(dun->one_off_below);
  mem_free(dun->cent);
  mem_free(dun->ent_n);
  for (uVar1 = 0; uVar1 < z_info->level_room_max; uVar1 = uVar1 + 1) {
    mem_free(dun->ent[uVar1]);
  }
  mem_free(dun->ent);
  p = dun->ent2room;
  if (p != (int **)0x0) {
    lVar2 = 0;
    while (*(void **)((long)p + lVar2) != (void *)0x0) {
      mem_free(*(void **)((long)p + lVar2));
      lVar2 = lVar2 + 8;
      p = dun->ent2room;
    }
    mem_free(p);
  }
  mem_free(dun->door);
  mem_free(dun->wall);
  mem_free(dun->tunn);
  return;
}

Assistant:

static void cleanup_dun_data(struct dun_data *dd)
{
	int i;

	cave_connectors_free(dun->join);
	cave_connectors_free(dun->one_off_above);
	cave_connectors_free(dun->one_off_below);
	mem_free(dun->cent);
	mem_free(dun->ent_n);
	for (i = 0; i < z_info->level_room_max; ++i) {
		mem_free(dun->ent[i]);
	}
	mem_free(dun->ent);
	if (dun->ent2room) {
		for (i = 0; dun->ent2room[i]; ++i) {
			mem_free(dun->ent2room[i]);
		}
		mem_free(dun->ent2room);
	}
	mem_free(dun->door);
	mem_free(dun->wall);
	mem_free(dun->tunn);
}